

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::values::detail::SignedCheck<int,true>::operator()
          (SignedCheck<int,_true> *this,bool negative,uint u,string *text)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  uint in_EDX;
  byte in_SIL;
  string *in_stack_00000058;
  argument_incorrect_type *in_stack_00000060;
  
  if ((in_SIL & 1) == 0) {
    uVar2 = std::numeric_limits<int>::max();
    if (uVar2 < in_EDX) {
      uVar3 = __cxa_allocate_exception(0x28);
      argument_incorrect_type::argument_incorrect_type(in_stack_00000060,in_stack_00000058);
      __cxa_throw(uVar3,&argument_incorrect_type::typeinfo,
                  argument_incorrect_type::~argument_incorrect_type);
    }
  }
  else {
    iVar1 = std::numeric_limits<int>::min();
    if ((uint)-iVar1 < in_EDX) {
      uVar3 = __cxa_allocate_exception(0x28);
      argument_incorrect_type::argument_incorrect_type(in_stack_00000060,in_stack_00000058);
      __cxa_throw(uVar3,&argument_incorrect_type::typeinfo,
                  argument_incorrect_type::~argument_incorrect_type);
    }
  }
  return;
}

Assistant:

void
                operator()(bool negative, U u, const std::string& text)
                {
                    if (negative)
                    {
                        if (u > static_cast<U>(-std::numeric_limits<T>::min()))
                        {
                            throw argument_incorrect_type(text);
                        }
                    }
                    else
                    {
                        if (u > static_cast<U>(std::numeric_limits<T>::max()))
                        {
                            throw argument_incorrect_type(text);
                        }
                    }
                }